

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void SPARSITY_INFO(int *nJdata,int *consP,int NCELLS)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  int k_1;
  long lVar15;
  int k;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  int iVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  int iVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined4 uVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  GpuArray<double,_100U> Jac;
  Real c_R [9];
  Real dcRdT [9];
  double adStack_5f0 [11];
  undefined1 local_598 [16];
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  undefined1 local_568 [16];
  undefined8 local_558;
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  undefined8 local_508;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0 [2];
  double adStack_4b0 [44];
  undefined1 auStack_350 [16];
  double local_340;
  double dStack_338;
  double local_330;
  double local_318;
  double dStack_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double dStack_2e8;
  double local_2e0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double dStack_298;
  double local_290;
  double local_228 [9];
  double local_1e0;
  double local_1d8 [5];
  undefined1 auStack_1b0 [16];
  undefined1 local_1a0 [16];
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_138;
  double local_128;
  double local_120;
  double local_118 [10];
  double local_c8 [10];
  double local_78 [10];
  
  adStack_5f0[0] = 5.87591778533349e-318;
  memset(&local_4f8,0,800);
  adStack_5f0[7] = 0.0;
  adStack_5f0[8] = 0.0;
  adStack_5f0[5] = 0.0;
  adStack_5f0[6] = 0.0;
  adStack_5f0[3] = 0.0;
  adStack_5f0[4] = 0.0;
  adStack_5f0[1] = 0.0;
  adStack_5f0[2] = 0.0;
  adStack_5f0[9] = 0.0;
  lVar12 = 1;
  auVar30 = _DAT_006979b0;
  do {
    if (SUB164(auVar30 ^ _DAT_006979c0,4) == -0x80000000 &&
        SUB164(auVar30 ^ _DAT_006979c0,0) < -0x7ffffff7) {
      adStack_5f0[lVar12] = 0.1111111111111111;
      adStack_5f0[lVar12 + 1] = 0.1111111111111111;
    }
    lVar15 = auVar30._8_8_;
    auVar30._0_8_ = auVar30._0_8_ + 2;
    auVar30._8_8_ = lVar15 + 2;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0xb);
  iVar31 = *consP;
  pdVar14 = &local_4f8;
  lVar12 = 0;
  adStack_5f0[0] = 5.87682192546538e-318;
  memset(pdVar14,0,800);
  local_568 = (undefined1  [16])0x0;
  local_578 = 0.0;
  dStack_570 = 0.0;
  local_588 = 0.0;
  dStack_580 = 0.0;
  local_598 = (undefined1  [16])0x0;
  local_558 = 0;
  local_170 = 0.0;
  do {
    local_170 = local_170 + adStack_5f0[lVar12 + 1];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 9);
  local_548 = 2.911342024497792;
  dStack_540 = 3.254512984911126;
  local_538 = -15.528347679998124;
  dStack_530 = 19.481084666666668;
  local_528 = 22.009669090999374;
  dStack_520 = 5.94295186894925;
  local_518 = 5.3818731557687505;
  dStack_510 = -5.101694818407498;
  local_508 = 0x4008a2a8a3a0d57d;
  local_178 = adStack_5f0[3] * 10.0 +
              adStack_5f0[2] * -0.21999999999999997 + adStack_5f0[1] + local_170;
  local_150 = adStack_5f0[2] * adStack_5f0[4];
  dVar16 = ((local_178 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  local_180 = dVar16 + 1.0;
  local_158 = dVar16 / local_180;
  local_160 = -0.0006207345732258481 / local_180;
  adStack_5f0[0] = 5.87839305421915e-318;
  local_190 = log10(dVar16);
  adStack_5f0[0] = 5.87850174866124e-318;
  local_188 = exp(-1.5e+33);
  local_188 = local_188 * 0.19999999999999996;
  local_138 = local_188 + 0.8;
  adStack_5f0[0] = 5.87873395951478e-318;
  local_128 = log10(local_138);
  local_148 = local_128 * -1.27 + 0.75;
  local_168 = local_128 * -0.67 + -0.4 + local_190;
  local_190 = 1.0 / (local_168 * -0.14 + local_148);
  local_168 = local_168 * local_190;
  local_120 = 1.0 / (local_168 * local_168 + 1.0);
  adStack_5f0[0] = 5.879598574395e-318;
  dVar16 = pow(10.0,local_128 * local_120);
  dVar49 = (local_128 + local_128) * local_120 * local_120 * local_168 * local_190;
  dVar42 = -local_148 * dVar49 * local_190;
  dVar16 = dVar16 * local_158;
  dVar43 = (local_150 * 118698922.25997423 + adStack_5f0[7] * -11503468.582662737) * dVar16;
  dVar49 = (local_150 * 47479.56890398969 +
           (((local_518 - (dStack_540 + dStack_530)) + 1.0) * -0.0006666666666666666 +
           0.00039999999999999996) * -11503468.582662737 * adStack_5f0[7]) * dVar16 +
           (dVar42 * -0.0006207345732258481 +
            (dVar49 * local_168 * -1.27 + dVar42 * -0.67 + local_120) *
            (local_188 / -1e-30 + -8e-31) * (0.43429448190325176 / local_138) + local_160) *
           2.302585092994046 * dVar43;
  local_598._8_8_ = (double)local_598._8_8_ - dVar43;
  dStack_580 = dStack_580 - dVar43;
  local_568._0_8_ = (double)local_568._0_8_ + dVar43;
  dVar42 = (1.0 / local_180 + dVar42) * (dVar43 / local_178);
  dVar43 = dVar16 * 118698922.25997423;
  dVar16 = dVar16 * 11503468.582662737;
  if (iVar31 == 0) {
    local_1d8[0] = dVar42 + dVar42;
    local_1d8[1] = dVar42 * 0.78 + adStack_5f0[4] * dVar43;
    local_1d8[2] = dVar42 * 11.0;
    local_1d8[3] = dVar43 * adStack_5f0[2] + dVar42;
    local_1d8[4] = dVar42;
    auStack_1b0._8_8_ = dVar42 - dVar16;
    auStack_1b0._0_8_ = dVar42;
    local_1a0._8_8_ = dVar42;
    local_1a0._0_8_ = dVar42;
    pdVar13 = &dStack_4f0;
    lVar12 = 0;
    do {
      dVar16 = local_1d8[lVar12];
      *pdVar13 = *pdVar13 - dVar16;
      pdVar13[2] = pdVar13[2] - dVar16;
      pdVar13[5] = dVar16 + pdVar13[5];
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dStack_4f0 = dStack_4f0 - dVar42;
    dStack_4e0 = dStack_4e0 - dVar42;
    local_4c8 = local_4c8 + dVar42;
    dVar59 = dVar42 * -0.21999999999999997 + adStack_5f0[4] * dVar43;
    adStack_4b0[2] = adStack_4b0[2] - dVar59;
    adStack_4b0[4] = adStack_4b0[4] - dVar59;
    adStack_4b0[7] = dVar59 + adStack_4b0[7];
    dVar42 = dVar42 * 10.0;
    adStack_4b0[0xc] = adStack_4b0[0xc] - dVar42;
    adStack_4b0[0xe] = adStack_4b0[0xe] - dVar42;
    adStack_4b0[0x11] = dVar42 + adStack_4b0[0x11];
    dVar43 = dVar43 * adStack_5f0[2];
    adStack_4b0[0x16] = adStack_4b0[0x16] - dVar43;
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar43;
    adStack_4b0[0x1b] = dVar43 + adStack_4b0[0x1b];
    dStack_310 = dStack_310 + dVar16;
    local_300 = local_300 + dVar16;
    dStack_2e8 = dStack_2e8 - dVar16;
  }
  local_228[1] = local_228[1] - dVar49;
  local_228[3] = local_228[3] - dVar49;
  local_228[6] = dVar49 + local_228[6];
  local_178 = adStack_5f0[3] * 11.0 + adStack_5f0[1] * 1.5 + local_170;
  local_180 = adStack_5f0[8];
  local_150 = ((local_178 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  adStack_5f0[0] = 5.88561629396135e-318;
  local_188 = log10(local_150);
  adStack_5f0[0] = 5.88572498840344e-318;
  local_158 = exp(-1.5e+33);
  local_158 = local_158 * 0.5;
  local_160 = local_158 + 0.5;
  adStack_5f0[0] = 5.88593743663115e-318;
  local_168 = log10(local_160);
  local_138 = local_168 * -1.27 + 0.75;
  local_148 = local_168 * -0.67 + -0.4 + local_188;
  local_188 = 1.0 / (local_148 * -0.14 + local_138);
  local_148 = local_148 * local_188;
  local_190 = 1.0 / (local_148 * local_148 + 1.0);
  adStack_5f0[0] = 5.88686133938887e-318;
  dVar16 = pow(10.0,local_168 * local_190);
  dVar49 = (local_168 + local_168) * local_190 * local_190 * local_148 * local_188;
  local_188 = -local_138 * dVar49 * local_188;
  dVar42 = local_150 + 1.0;
  dVar16 = (local_150 / dVar42) * dVar16;
  dVar43 = (local_180 * 25936106.98548031 + adStack_5f0[6] * adStack_5f0[6] * -3419315.29664768) *
           dVar16;
  dVar49 = (local_180 * 280925.8837546357 +
           ((((dStack_520 + dStack_520) - dStack_510) + -1.0) * -0.0006666666666666666 +
           0.010831459166632262) * -3419315.29664768 * adStack_5f0[6] * adStack_5f0[6]) * dVar16 +
           (local_188 * -0.0002845931413337665 +
            (dVar49 * local_148 * -1.27 + local_188 * -0.67 + local_190) *
            (local_158 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_160) +
           -0.0002845931413337665 / dVar42) * 2.302585092994046 * dVar43;
  dStack_570 = dVar43 + dVar43 + dStack_570;
  local_568._8_8_ = (double)local_568._8_8_ - dVar43;
  local_1d8[1] = (1.0 / dVar42 + local_188) * (dVar43 / local_178);
  dVar42 = dVar16 * 25936106.98548031;
  if (iVar31 == 0) {
    local_1d8[0] = local_1d8[1] * 2.5;
    local_1d8[2] = local_1d8[1] * 12.0;
    local_1d8[3] = local_1d8[1];
    local_1d8[4] = local_1d8[1];
    auStack_1b0._8_8_ = local_1d8[1];
    auStack_1b0._0_8_ = dVar16 * 3419315.29664768 * -2.0 * adStack_5f0[6] + local_1d8[1];
    local_1a0._8_8_ = local_1d8[1];
    local_1a0._0_8_ = dVar42 + local_1d8[1];
    pdVar13 = local_4c0;
    lVar12 = 0;
    do {
      dVar16 = local_1d8[lVar12];
      pdVar13[-2] = dVar16 + dVar16 + pdVar13[-2];
      *pdVar13 = *pdVar13 - dVar16;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar43 = local_1d8[1] * 1.5;
    local_4d0 = dVar43 + dVar43 + local_4d0;
    local_4c0[0] = local_4c0[0] - dVar43;
    local_1d8[1] = local_1d8[1] * 11.0;
    adStack_4b0[0x10] = local_1d8[1] + local_1d8[1] + adStack_4b0[0x10];
    adStack_4b0[0x12] = adStack_4b0[0x12] - local_1d8[1];
    dVar16 = dVar16 * 3419315.29664768 * -2.0 * adStack_5f0[6];
    local_340 = dVar16 + dVar16 + local_340;
    local_330 = local_330 - dVar16;
    local_2a0 = dVar42 + dVar42 + local_2a0;
    local_290 = local_290 - dVar42;
  }
  local_228[5] = dVar49 + dVar49 + local_228[5];
  local_228[7] = local_228[7] - dVar49;
  dVar42 = adStack_5f0[3] * 11.0 + adStack_5f0[1] * 1.5 + local_170;
  local_1d8[1] = adStack_5f0[1] * 1.0145869685785861e-06 +
                 adStack_5f0[4] * adStack_5f0[4] * -407.1662961015109;
  dVar43 = dVar42 * local_1d8[1];
  dVar16 = (adStack_5f0[1] * 2.2738361995042403e-08 +
           ((((dStack_530 + dStack_530) - local_548) + -1.0) * -0.0006666666666666666 +
           0.022411446922976298) * -407.1662961015109 * adStack_5f0[4] * adStack_5f0[4]) * dVar42;
  local_598._0_8_ = (double)local_598._0_8_ - dVar43;
  dStack_580 = dVar43 + dVar43 + dStack_580;
  if (iVar31 == 0) {
    local_1d8[0] = local_1d8[1] * 2.5 + dVar42 * 1.0145869685785861e-06;
    local_1d8[2] = local_1d8[1] * 12.0;
    local_1d8[3] = dVar42 * 407.1662961015109 * -2.0 * adStack_5f0[4] + local_1d8[1];
    local_1d8[4] = local_1d8[1];
    auStack_1b0._8_8_ = local_1d8[1];
    auStack_1b0._0_8_ = local_1d8[1];
    local_1a0._8_8_ = local_1d8[1];
    local_1a0._0_8_ = local_1d8[1];
    pdVar13 = &local_4f8;
    lVar12 = 0;
    do {
      dVar42 = local_1d8[lVar12];
      *pdVar13 = *pdVar13 - dVar42;
      pdVar13[3] = dVar42 + dVar42 + pdVar13[3];
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar43 = local_1d8[1] * 1.5 + dVar42 * 1.0145869685785861e-06;
    local_4f8 = local_4f8 - dVar43;
    dStack_4e0 = dVar43 + dVar43 + dStack_4e0;
    local_1d8[1] = local_1d8[1] * 11.0;
    adStack_4b0[0xb] = adStack_4b0[0xb] - local_1d8[1];
    dVar42 = dVar42 * 407.1662961015109 * -2.0 * adStack_5f0[4];
    adStack_4b0[0xe] = local_1d8[1] + local_1d8[1] + adStack_4b0[0xe];
    adStack_4b0[0x15] = adStack_4b0[0x15] - dVar42;
    adStack_4b0[0x18] = dVar42 + dVar42 + adStack_4b0[0x18];
  }
  local_228[0] = local_228[0] - dVar16;
  local_228[3] = dVar16 + dVar16 + local_228[3];
  dVar43 = adStack_5f0[3] * 11.0 + adStack_5f0[1] * 1.5 + local_170;
  local_1d8[3] = adStack_5f0[5] * adStack_5f0[5] * 159.17961552912485 +
                 adStack_5f0[2] * -2.0846475553480232e-08;
  dVar42 = dVar43 * local_1d8[3];
  dVar16 = (adStack_5f0[5] * adStack_5f0[5] * -0.05305987184304161 +
           (((dStack_540 - (local_528 + local_528)) + 1.0) * -0.0006666666666666666 +
           -0.0003333333333333333) * -2.0846475553480232e-08 * adStack_5f0[2]) * dVar43;
  local_598._8_8_ = (double)local_598._8_8_ + dVar42;
  local_578 = local_578 - (dVar42 + dVar42);
  dVar42 = dVar43 * 159.17961552912485;
  dVar43 = dVar43 * 2.0846475553480232e-08;
  if (iVar31 == 0) {
    local_1d8[0] = local_1d8[3] * 2.5;
    local_1d8[1] = local_1d8[3] - dVar43;
    local_1d8[2] = local_1d8[3] * 12.0;
    local_1d8[4] = (dVar42 + dVar42) * adStack_5f0[5] + local_1d8[3];
    uVar48 = (undefined4)((ulong)local_1d8[3] >> 0x20);
    local_1a0._8_4_ = SUB84(local_1d8[3],0);
    local_1a0._0_8_ = local_1d8[3];
    local_1a0._12_4_ = uVar48;
    auStack_1b0._8_4_ = SUB84(local_1d8[3],0);
    auStack_1b0._0_8_ = local_1d8[3];
    auStack_1b0._12_4_ = uVar48;
    pdVar13 = &dStack_4f0;
    lVar12 = 0;
    do {
      dVar42 = local_1d8[lVar12];
      *pdVar13 = *pdVar13 + dVar42;
      pdVar13[3] = pdVar13[3] - (dVar42 + dVar42);
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar49 = local_1d8[3] * 1.5;
    dStack_4f0 = dStack_4f0 + dVar49;
    dStack_4d8 = dStack_4d8 - (dVar49 + dVar49);
    adStack_4b0[2] = adStack_4b0[2] - dVar43;
    adStack_4b0[5] = adStack_4b0[5] - dVar43 * -2.0;
    local_1d8[3] = local_1d8[3] * 11.0;
    adStack_4b0[0xc] = adStack_4b0[0xc] + local_1d8[3];
    dVar42 = (dVar42 + dVar42) * adStack_5f0[5];
    adStack_4b0[0xf] = adStack_4b0[0xf] - (local_1d8[3] + local_1d8[3]);
    adStack_4b0[0x20] = adStack_4b0[0x20] + dVar42;
    adStack_4b0[0x23] = adStack_4b0[0x23] - (dVar42 + dVar42);
  }
  local_228[1] = local_228[1] + dVar16;
  local_228[4] = local_228[4] - (dVar16 + dVar16);
  local_1d8[1] = adStack_5f0[4] * adStack_5f0[5] * 3142.6666666666665 +
                 adStack_5f0[6] * -5.646680545093694e-06;
  dVar49 = adStack_5f0[3] * 11.0 + adStack_5f0[1] * 1.5 + local_170;
  dVar42 = dVar49 * local_1d8[1];
  dVar43 = (adStack_5f0[4] * adStack_5f0[5] * -2.095111111111111 +
           (((dStack_520 - (dStack_530 + local_528)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -5.646680545093694e-06 * adStack_5f0[6]) * dVar49;
  dVar16 = dStack_580 - dVar42;
  local_578 = local_578 - dVar42;
  auVar1._8_4_ = SUB84(local_578,0);
  auVar1._0_8_ = dVar16;
  auVar1._12_4_ = (int)((ulong)local_578 >> 0x20);
  dStack_580 = dVar16;
  local_578 = auVar1._8_8_;
  dStack_570 = dVar42 + dStack_570;
  dVar42 = dVar49 * 3142.6666666666665;
  dVar49 = dVar49 * 5.646680545093694e-06;
  if (iVar31 == 0) {
    local_1d8[0] = local_1d8[1] * 2.5;
    local_1d8[2] = local_1d8[1] * 12.0;
    local_1d8[3] = adStack_5f0[5] * dVar42 + local_1d8[1];
    local_1d8[4] = adStack_5f0[4] * dVar42 + local_1d8[1];
    auStack_1b0._0_8_ = local_1d8[1] - dVar49;
    auStack_1b0._8_8_ = local_1d8[1];
    local_1a0._0_8_ = local_1d8[1];
    local_1a0._8_8_ = local_1d8[1];
    pdVar13 = &local_4d0;
    lVar12 = 0;
    do {
      dVar42 = local_1d8[lVar12];
      pdVar13[-2] = pdVar13[-2] - dVar42;
      pdVar13[-1] = pdVar13[-1] - dVar42;
      *pdVar13 = dVar42 + *pdVar13;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar59 = local_1d8[1] * 1.5;
    dStack_4e0 = dStack_4e0 - dVar59;
    dStack_4d8 = dStack_4d8 - dVar59;
    local_4d0 = dVar59 + local_4d0;
    local_1d8[1] = local_1d8[1] * 11.0;
    adStack_4b0[0xe] = adStack_4b0[0xe] - local_1d8[1];
    adStack_4b0[0xf] = adStack_4b0[0xf] - local_1d8[1];
    adStack_4b0[0x10] = local_1d8[1] + adStack_4b0[0x10];
    dVar59 = adStack_5f0[5] * dVar42;
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar59;
    adStack_4b0[0x19] = adStack_4b0[0x19] - dVar59;
    dVar42 = dVar42 * adStack_5f0[4];
    adStack_4b0[0x1a] = dVar59 + adStack_4b0[0x1a];
    adStack_4b0[0x22] = adStack_4b0[0x22] - dVar42;
    adStack_4b0[0x23] = adStack_4b0[0x23] - dVar42;
    adStack_4b0[0x24] = dVar42 + adStack_4b0[0x24];
    auVar2._8_4_ = SUB84(dVar49 + (double)auStack_350._8_8_,0);
    auVar2._0_8_ = dVar49 + (double)auStack_350._0_8_;
    auVar2._12_4_ = (int)((ulong)(dVar49 + (double)auStack_350._8_8_) >> 0x20);
    auStack_350 = auVar2;
    local_340 = local_340 - dVar49;
  }
  local_228[3] = local_228[3] - dVar43;
  local_228[4] = local_228[4] - dVar43;
  local_228[5] = dVar43 + local_228[5];
  dVar49 = adStack_5f0[3] * 11.0 + adStack_5f0[1] * 1.5 + local_170;
  local_1d8[1] = adStack_5f0[4] * adStack_5f0[6] * 16888.888888888887 +
                 adStack_5f0[3] * -1.4321870058604512e-06;
  dVar59 = dVar49 * local_1d8[1];
  dVar42 = (adStack_5f0[4] * adStack_5f0[6] * -22.518518518518515 +
           (((local_538 - (dStack_530 + dStack_520)) + 1.0) * -0.0006666666666666666 +
           -0.0013333333333333333) * -1.4321870058604512e-06 * adStack_5f0[3]) * dVar49;
  local_588 = local_588 + dVar59;
  dStack_580 = dVar16 - dVar59;
  dStack_570 = dStack_570 - dVar59;
  dVar43 = dVar49 * 16888.888888888887;
  if (iVar31 == 0) {
    local_1d8[0] = local_1d8[1] * 2.5;
    local_1d8[2] = -(dVar49 * 1.4321870058604512e-06) + local_1d8[1] * 12.0;
    local_1d8[3] = local_1d8[1] + adStack_5f0[6] * dVar43;
    local_1d8[4] = local_1d8[1];
    auStack_1b0._8_8_ = local_1d8[1];
    auStack_1b0._0_8_ = dVar43 * adStack_5f0[4] + local_1d8[1];
    local_1a0._8_8_ = local_1d8[1];
    local_1a0._0_8_ = local_1d8[1];
    pdVar13 = &local_4e8;
    lVar12 = 0;
    do {
      dVar43 = local_1d8[lVar12];
      *pdVar13 = *pdVar13 + dVar43;
      pdVar13[1] = pdVar13[1] - dVar43;
      pdVar13[3] = pdVar13[3] - dVar43;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 10;
    } while (lVar12 != 9);
  }
  else {
    dVar50 = local_1d8[1] * 1.5;
    local_4e8 = local_4e8 + dVar50;
    dStack_4e0 = dStack_4e0 - dVar50;
    local_4d0 = local_4d0 - dVar50;
    dVar49 = local_1d8[1] * 11.0 - dVar49 * 1.4321870058604512e-06;
    adStack_4b0[0xd] = adStack_4b0[0xd] + dVar49;
    adStack_4b0[0xe] = adStack_4b0[0xe] - dVar49;
    adStack_4b0[0x10] = adStack_4b0[0x10] - dVar49;
    dVar49 = adStack_5f0[6] * dVar43;
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar49;
    adStack_4b0[0x17] = adStack_4b0[0x17] + dVar49;
    adStack_4b0[0x1a] = adStack_4b0[0x1a] - dVar49;
    dVar43 = dVar43 * adStack_5f0[4];
    adStack_4b0[0x2b] = adStack_4b0[0x2b] + dVar43;
    auStack_350._0_8_ = (double)auStack_350._0_8_ - dVar43;
    local_340 = local_340 - dVar43;
  }
  dVar60 = adStack_5f0[2] * adStack_5f0[4] * 694956.7634748495 +
           adStack_5f0[5] * adStack_5f0[6] * -9534710.169227276;
  dVar32 = adStack_5f0[2] * adStack_5f0[4] * 2391.8538305613447 +
           (0.0034417304158633542 -
           ((local_528 + dStack_520) - (dStack_540 + dStack_530)) * 0.0006666666666666666) *
           -9534710.169227276 * adStack_5f0[5] * adStack_5f0[6];
  dVar44 = adStack_5f0[4] * 694956.7634748495;
  dVar17 = adStack_5f0[2] * 694956.7634748495;
  dVar18 = adStack_5f0[6] * -9534710.169227276;
  dVar51 = adStack_5f0[5] * -9534710.169227276;
  dVar33 = adStack_5f0[5] * adStack_5f0[1] * 1860366.9115799016 +
           adStack_5f0[4] * adStack_5f0[6] * -1341454.8115373214;
  dVar43 = adStack_5f0[5] * 1860366.9115799016;
  dStack_4d8 = dStack_4d8 - dVar43;
  dVar45 = adStack_5f0[5] * adStack_5f0[1] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((dStack_530 + dStack_520) - (local_548 + local_528)) * 0.0006666666666666666) *
           -1341454.8115373214 * adStack_5f0[4] * adStack_5f0[6];
  dVar49 = adStack_5f0[6] * -1341454.8115373214;
  adStack_4b0[0x19] = (dVar17 + adStack_4b0[0x19]) - dVar49;
  dVar19 = adStack_5f0[1] * 1860366.9115799016;
  adStack_4b0[0x1f] = adStack_4b0[0x1f] - dVar19;
  adStack_4b0[0x22] = (adStack_4b0[0x22] - dVar18) + dVar19;
  dVar61 = adStack_5f0[4] * -1341454.8115373214;
  dVar67 = adStack_5f0[6] * adStack_5f0[1] * 4271828.084344627 +
           adStack_5f0[4] * adStack_5f0[3] * -145376.75098299314;
  dVar20 = adStack_5f0[6] * 4271828.084344627;
  local_4e8 = dVar20 + local_4e8;
  local_4d0 = (dVar43 + local_4d0) - dVar20;
  dVar21 = adStack_5f0[4] * -145376.75098299314;
  adStack_4b0[0xb] = adStack_4b0[0xb] - dVar21;
  dVar65 = adStack_5f0[1] * 4271828.084344627;
  adStack_4b0[0x29] = (adStack_4b0[0x29] - dVar61) - dVar65;
  dVar34 = adStack_5f0[5] * adStack_5f0[3] * 86324.17110758815 +
           adStack_5f0[6] * adStack_5f0[6] * -1829063.0057653617;
  dVar41 = adStack_5f0[7] * adStack_5f0[4] * 12595057.621245861 +
           adStack_5f0[2] * adStack_5f0[1] * -0.32384379658070717;
  dVar52 = adStack_5f0[6] * adStack_5f0[1] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((local_538 + dStack_530) - (local_548 + dStack_520)) * 0.0006666666666666666) *
           -145376.75098299314 * adStack_5f0[4] * adStack_5f0[3];
  dVar74 = adStack_5f0[5] * adStack_5f0[3] * 374.95779706744673 +
           (0.00434360147634811 -
           ((dStack_520 + dStack_520) - (local_538 + local_528)) * 0.0006666666666666666) *
           -1829063.0057653617 * adStack_5f0[6] * adStack_5f0[6];
  dVar76 = adStack_5f0[7] * adStack_5f0[4] * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_548 + dStack_540) - (dStack_530 + local_518)) * 0.0006666666666666666) *
           -0.32384379658070717 * adStack_5f0[2] * adStack_5f0[1];
  dVar53 = adStack_5f0[5] * 86324.17110758815;
  adStack_4b0[0xf] = adStack_4b0[0xf] - dVar53;
  dVar22 = adStack_5f0[3] * 86324.17110758815;
  adStack_4b0[0x21] = adStack_4b0[0x21] - dVar22;
  dVar23 = adStack_5f0[6] * -3658126.0115307234;
  dVar73 = adStack_5f0[2] * -0.32384379658070717;
  dStack_4f0 = dVar73 + dStack_4f0;
  dVar24 = adStack_5f0[1] * -0.32384379658070717;
  adStack_4b0[1] = dVar24 + adStack_4b0[1];
  adStack_4b0[4] = (adStack_4b0[4] - dVar44) - dVar24;
  dVar68 = adStack_5f0[7] * 12595057.621245861;
  dVar70 = adStack_5f0[4] * 12595057.621245861;
  dVar50 = adStack_5f0[3] * -145376.75098299314;
  dVar10 = dVar50 + (adStack_4b0[0x18] - dVar17) + dVar49;
  auVar3._8_4_ = SUB84(dVar10,0);
  auVar3._0_8_ = dVar50 + adStack_4b0[0x17];
  auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
  dVar10 = ((dVar32 + local_228[4]) - dVar45) - dVar74;
  dVar11 = (dVar45 + dVar32 + (local_228[5] - dVar42)) - dVar52;
  auVar4._8_4_ = SUB84(dVar11,0);
  auVar4._0_8_ = dVar10;
  auVar4._12_4_ = (int)((ulong)dVar11 >> 0x20);
  local_228[5] = auVar4._8_8_;
  dVar11 = (dVar67 + local_588) - dVar34;
  dVar16 = (dVar67 + ((dVar16 - dVar59) - dVar60) + dVar33) - dVar41;
  auVar5._8_4_ = SUB84(dVar16,0);
  auVar5._0_8_ = dVar11;
  auVar5._12_4_ = (int)((ulong)dVar16 >> 0x20);
  dStack_580 = auVar5._8_8_;
  adStack_4b0[0x16] = dVar68 + (adStack_4b0[0x16] - dVar17);
  adStack_4b0[0x18] = auVar3._8_8_;
  dVar16 = (dVar52 + local_228[2] + dVar42) - dVar74;
  dVar42 = (dVar52 + ((local_228[3] - dVar42) - dVar32) + dVar45) - dVar76;
  auVar6._8_4_ = SUB84(dVar42,0);
  auVar6._0_8_ = dVar16;
  auVar6._12_4_ = (int)((ulong)dVar42 >> 0x20);
  dVar66 = adStack_5f0[7] * adStack_5f0[4] * 64119709.90701692 +
           adStack_5f0[6] * adStack_5f0[6] * -16.310006106092114;
  dVar54 = adStack_5f0[7] * adStack_5f0[4] * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_520 + dStack_520) - (dStack_530 + local_518)) * 0.0006666666666666666) *
           -16.310006106092114 * adStack_5f0[6] * adStack_5f0[6];
  dVar25 = adStack_5f0[7] * 64119709.90701692;
  dVar35 = adStack_5f0[6] * -32.62001221218423;
  dVar63 = adStack_5f0[4] * 64119709.90701692;
  local_228[3] = auVar6._8_8_;
  dVar36 = adStack_5f0[7] * adStack_5f0[5] * 32500000.0 +
           adStack_5f0[6] * adStack_5f0[2] * -0.6025543492746578;
  dVar42 = adStack_5f0[7] * adStack_5f0[5] * 0.0 +
           (0.0 - ((dStack_540 + dStack_520) - (local_528 + local_518)) * 0.0006666666666666666) *
           -0.6025543492746578 * adStack_5f0[6] * adStack_5f0[2];
  local_180 = dVar44 + adStack_4b0[5];
  local_178 = dVar44 + adStack_4b0[6];
  local_170 = adStack_4b0[7] - dVar24;
  dVar72 = adStack_5f0[7] * 32500000.0;
  adStack_4b0[0x20] = (adStack_4b0[0x20] - dVar18) + dVar72;
  dVar26 = adStack_5f0[2] * -0.6025543492746578;
  dVar69 = adStack_5f0[5] * 32500000.0;
  dVar27 = adStack_5f0[6] * 34143562.115192875;
  dVar59 = dVar70 + dStack_310 + dVar69 + dVar27;
  auVar7._8_4_ = SUB84(local_308 + dVar27,0);
  auVar7._0_8_ = dVar59;
  auVar7._12_4_ = (int)((ulong)(local_308 + dVar27) >> 0x20);
  dVar9 = (dVar63 + dVar63 + local_2f0 + dVar69) - dVar27;
  dVar27 = (((dStack_2e8 - dVar70) - dVar63) - dVar69) - dVar27;
  auVar8._8_4_ = SUB84(dVar27,0);
  auVar8._0_8_ = dVar9;
  auVar8._12_4_ = (int)((ulong)dVar27 >> 0x20);
  dVar75 = adStack_5f0[8] * -150.1634478502138;
  dVar28 = adStack_5f0[7] * 15085094.926858293;
  local_308 = auVar7._8_8_;
  dStack_2e8 = auVar8._8_8_;
  dVar37 = adStack_5f0[2] * -150.1634478502138;
  dVar55 = adStack_5f0[6] * -0.6025543492746578;
  adStack_4b0[5] = (dVar44 + adStack_4b0[5]) - dVar55;
  dVar38 = adStack_5f0[3] * -0.029876205886692417;
  adStack_4b0[3] = adStack_4b0[3] + dVar38;
  adStack_4b0[6] = (dVar44 + adStack_4b0[6] + dVar55) - dVar38;
  dVar39 = adStack_5f0[2] * -0.029876205886692417;
  adStack_4b0[0xc] = adStack_4b0[0xc] + dVar39;
  dVar71 = adStack_5f0[7] * 34143562.115192875;
  adStack_4b0[0x2a] = (adStack_4b0[0x2a] - dVar51) + dVar26 + dVar71;
  dVar46 = adStack_5f0[7] * adStack_5f0[7] * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_540 + dStack_510) - (local_518 + local_518)) * 0.0006666666666666666) *
           -150.1634478502138 * adStack_5f0[8] * adStack_5f0[2];
  dVar47 = adStack_5f0[6] * adStack_5f0[7] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_540 + local_538) - (dStack_520 + local_518)) * 0.0006666666666666666) *
           -0.029876205886692417 * adStack_5f0[2] * adStack_5f0[3];
  dVar56 = adStack_5f0[7] * adStack_5f0[7] * 7542547.463429146 +
           adStack_5f0[8] * adStack_5f0[2] * -150.1634478502138;
  dVar58 = adStack_5f0[6] * adStack_5f0[7] * 34143562.115192875 +
           adStack_5f0[2] * adStack_5f0[3] * -0.029876205886692417;
  dVar64 = adStack_5f0[7] * adStack_5f0[7] * 224556.7351007675 +
           adStack_5f0[8] * adStack_5f0[2] * -4.470666408692084;
  dVar27 = adStack_5f0[7] * adStack_5f0[7] * -81.82756742036453 +
           (-0.0003643959615980579 -
           ((dStack_540 + dStack_510) - (local_518 + local_518)) * 0.0006666666666666666) *
           -4.470666408692084 * adStack_5f0[8] * adStack_5f0[2];
  dVar29 = adStack_5f0[8] * -4.470666408692084;
  adStack_4b0[2] = dVar24 + (adStack_4b0[2] - dVar44) + dVar55 + dVar38 + dVar75 + dVar29;
  adStack_4b0[7] =
       ((((adStack_4b0[7] - dVar24) - dVar55) - dVar38) - (dVar75 + dVar75)) - (dVar29 + dVar29);
  adStack_4b0[8] = dVar29 + adStack_4b0[8] + dVar75;
  dVar29 = adStack_5f0[7] * 449113.470201535;
  adStack_5f0[2] = adStack_5f0[2] * -4.470666408692084;
  local_2c0 = local_2c0 + dVar37 + adStack_5f0[2];
  local_228[1] = (local_228[1] - dVar32) + dVar76 + dVar42 + dVar47 + dVar46 + dVar27;
  dVar62 = adStack_5f0[8] * adStack_5f0[4] * 6362141.693962547 +
           adStack_5f0[3] * adStack_5f0[6] * -7.112730406981104e-05;
  dVar57 = adStack_5f0[8] * adStack_5f0[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_538 + dStack_520) - (dStack_530 + dStack_510)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * adStack_5f0[3] * adStack_5f0[6];
  dVar38 = adStack_5f0[6] * -7.112730406981104e-05;
  adStack_4b0[0xe] = (dVar21 + adStack_4b0[0xe]) - dVar38;
  dVar44 = adStack_5f0[8] * 6362141.693962547;
  adStack_4b0[0x1a] = dVar25 + dVar25 + ((dVar49 + dVar17 + adStack_4b0[0x1a]) - dVar50) + dVar44;
  dVar32 = adStack_5f0[3] * -7.112730406981104e-05;
  dVar17 = adStack_5f0[4] * 6362141.693962547;
  dVar24 = adStack_5f0[8] * adStack_5f0[4] * 3347824.3674030215 +
           adStack_5f0[1] * adStack_5f0[7] * -4323.663734083463;
  dVar75 = adStack_5f0[8] * adStack_5f0[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_548 + local_518) - (dStack_530 + dStack_510)) * 0.0006666666666666666) *
           -4323.663734083463 * adStack_5f0[1] * adStack_5f0[7];
  local_598._8_8_ = dVar41 + ((double)local_598._8_8_ - dVar60) + dVar36 + dVar58 + dVar56 + dVar64;
  local_598._0_8_ = dVar41 + (((double)local_598._0_8_ - dVar33) - dVar67) + dVar24;
  dStack_580 = ((dStack_580 - dVar66) - dVar62) - dVar24;
  dVar55 = adStack_5f0[7] * -4323.663734083463;
  local_4f8 = dVar73 + ((local_4f8 - dVar43) - dVar20) + dVar55;
  dStack_4e0 = ((dVar20 + dStack_4e0 + dVar43) - dVar73) - dVar55;
  local_4c8 = (local_4c8 - dVar73) + dVar55;
  local_4c0[0] = local_4c0[0] - dVar55;
  dVar43 = adStack_5f0[8] * 3347824.3674030215;
  adStack_4b0[0x15] = dVar68 + ((adStack_4b0[0x15] - dVar49) - dVar50) + dVar43;
  adStack_4b0[0x18] = (((adStack_4b0[0x18] - dVar68) - dVar25) - dVar44) - dVar43;
  adStack_4b0[0x17] = dVar50 + adStack_4b0[0x17] + dVar44;
  adStack_4b0[0x1b] = ((adStack_4b0[0x1b] - dVar68) - dVar25) + dVar43;
  adStack_5f0[1] = adStack_5f0[1] * -4323.663734083463;
  adStack_4b0[0x1c] = (adStack_4b0[0x1c] - dVar44) - dVar43;
  local_318 = dVar70 + local_318 + adStack_5f0[1];
  local_300 = ((local_300 - dVar70) - dVar63) - adStack_5f0[1];
  adStack_5f0[4] = adStack_5f0[4] * 3347824.3674030215;
  local_2c8 = local_2c8 + adStack_5f0[4];
  local_2b0 = (local_2b0 - dVar17) - adStack_5f0[4];
  local_228[0] = ((local_228[0] - dVar45) - dVar52) + dVar76 + dVar75;
  dVar25 = adStack_5f0[8] * adStack_5f0[5] * 5672469.694980093 +
           adStack_5f0[7] * adStack_5f0[6] * -5282.492258864639;
  dVar43 = adStack_5f0[8] * adStack_5f0[5] * 12599.866574880663 +
           (0.0022212311836643283 -
           ((dStack_520 + local_518) - (local_528 + dStack_510)) * 0.0006666666666666666) *
           -5282.492258864639 * adStack_5f0[7] * adStack_5f0[6];
  local_578 = ((((dVar60 + local_578) - dVar33) - dVar34) - dVar36) - dVar25;
  dVar49 = adStack_5f0[8] * 5672469.694980093;
  adStack_4b0[0x23] = ((((dVar18 + adStack_4b0[0x23]) - dVar19) - dVar22) - dVar72) - dVar49;
  adStack_4b0[0x24] = dVar49 + dVar22 + dVar22 + dVar19 + dVar18 + adStack_4b0[0x24] + dVar72;
  adStack_4b0[0x25] = dVar49 + (adStack_4b0[0x25] - dVar72);
  adStack_4b0[0x26] = adStack_4b0[0x26] - dVar49;
  dVar44 = adStack_5f0[7] * -5282.492258864639;
  auStack_350._8_8_ = ((((dVar51 + (double)auStack_350._8_8_) - dVar61) - dVar23) - dVar26) - dVar44
  ;
  auStack_350._0_8_ = ((dVar65 + ((double)auStack_350._0_8_ - dVar51) + dVar61) - dVar35) - dVar32;
  dVar50 = adStack_5f0[6] * -5282.492258864639;
  local_2f8 = (local_2f8 - dVar69) - dVar50;
  adStack_5f0[5] = adStack_5f0[5] * 5672469.694980093;
  local_2a8 = local_2a8 - adStack_5f0[5];
  dVar55 = adStack_5f0[8] * adStack_5f0[6] * 1000000.0 +
           adStack_5f0[7] * adStack_5f0[3] * -43.95116952269832;
  dVar20 = adStack_5f0[8] * adStack_5f0[6] * 0.0 +
           (0.0 - ((local_538 + local_518) - (dStack_520 + dStack_510)) * 0.0006666666666666666) *
           -43.95116952269832 * adStack_5f0[7] * adStack_5f0[3];
  dVar18 = adStack_5f0[7] * -43.95116952269832;
  dVar45 = adStack_5f0[8] * 1000000.0;
  dVar49 = adStack_5f0[3] * -43.95116952269832;
  dVar22 = adStack_5f0[6] * 1000000.0;
  dVar52 = adStack_5f0[8] * adStack_5f0[6] * 23496864.50220335 +
           adStack_5f0[7] * adStack_5f0[3] * -1032.714674988212;
  dVar19 = adStack_5f0[8] * adStack_5f0[6] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_538 + local_518) - (dStack_520 + dStack_510)) * 0.0006666666666666666) *
           -1032.714674988212 * adStack_5f0[7] * adStack_5f0[3];
  local_588 = dVar11 + dVar58 + dVar62 + dVar55 + dVar52;
  dStack_570 = ((dVar25 + ((dVar66 + dVar66 +
                            dVar34 + dVar34 + ((dVar33 + dVar60 + dStack_570) - dVar67) + dVar36) -
                          dVar58) + dVar62) - dVar55) - dVar52;
  local_568._8_8_ =
       (((((dVar64 + dVar56 + (double)local_568._8_8_) - dVar62) - dVar24) - dVar25) - dVar55) -
       dVar52;
  local_568._0_8_ =
       dVar25 + (((((((double)local_568._0_8_ - dVar41) - dVar66) - dVar36) - dVar58) -
                 (dVar56 + dVar56)) - (dVar64 + dVar64)) + dVar24 + dVar55 + dVar52;
  adStack_5f0[7] = adStack_5f0[7] * -1032.714674988212;
  adStack_4b0[0xd] =
       ((dVar21 + adStack_4b0[0xd]) - dVar53) + dVar39 + dVar38 + dVar18 + adStack_5f0[7];
  adStack_4b0[0x10] =
       ((((dVar53 + dVar53 + (adStack_4b0[0x10] - dVar21)) - dVar39) + dVar38) - dVar18) -
       adStack_5f0[7];
  adStack_4b0[0x11] = (adStack_4b0[0x11] - dVar39) + dVar18 + adStack_5f0[7];
  adStack_4b0[0x12] = ((adStack_4b0[0x12] - dVar38) - dVar18) - adStack_5f0[7];
  adStack_5f0[8] = adStack_5f0[8] * 23496864.50220335;
  adStack_4b0[0x2b] =
       ((dVar65 + adStack_4b0[0x2b]) - dVar23) + dVar71 + dVar32 + dVar45 + adStack_5f0[8];
  local_340 = ((dVar44 + ((dVar35 + dVar35 +
                           dVar23 + dVar23 + ((dVar61 + dVar51 + local_340) - dVar65) + dVar26) -
                         dVar71) + dVar32) - dVar45) - adStack_5f0[8];
  dStack_338 = dVar44 + (((dStack_338 - dVar35) - dVar26) - dVar71) + dVar45 + adStack_5f0[8];
  adStack_5f0[3] = adStack_5f0[3] * -1032.714674988212;
  local_330 = (((local_330 - dVar32) - dVar44) - dVar45) - adStack_5f0[8];
  local_308 = local_308 + dVar49 + adStack_5f0[3];
  dStack_310 = dVar59 + dVar28 + dVar29;
  dStack_2e8 = dVar50 + ((dStack_2e8 - (dVar28 + dVar28)) - (dVar29 + dVar29)) + adStack_5f0[1] +
               dVar49 + adStack_5f0[3];
  local_2f0 = ((dVar50 + dVar9) - dVar49) - adStack_5f0[3];
  local_2e0 = ((((dVar29 + dVar28 + local_2e0) - adStack_5f0[1]) - dVar50) - dVar49) -
              adStack_5f0[3];
  adStack_5f0[6] = adStack_5f0[6] * 23496864.50220335;
  local_2b8 = local_2b8 + dVar17 + dVar22 + adStack_5f0[6];
  local_2a0 = ((adStack_5f0[5] + local_2a0 + dVar17) - dVar22) - adStack_5f0[6];
  dStack_298 = adStack_5f0[5] +
               ((dStack_298 - (dVar37 + dVar37)) - (adStack_5f0[2] + adStack_5f0[2])) +
               adStack_5f0[4] + dVar22 + adStack_5f0[6];
  local_290 = (((((adStack_5f0[2] + dVar37 + local_290) - dVar17) - adStack_5f0[4]) - adStack_5f0[5]
               ) - dVar22) - adStack_5f0[6];
  local_228[3] = ((local_228[3] - dVar54) - dVar57) - dVar75;
  local_228[2] = dVar16 + dVar47 + dVar57 + dVar20 + dVar19;
  local_228[5] = ((dVar43 + ((dVar54 + dVar54 + dVar74 + dVar74 + local_228[5] + dVar42) - dVar47) +
                            dVar57) - dVar20) - dVar19;
  local_228[4] = (dVar10 - dVar42) - dVar43;
  local_228[6] = dVar43 + ((((((local_228[6] - dVar76) - dVar54) - dVar42) - dVar47) -
                           (dVar46 + dVar46)) - (dVar27 + dVar27)) + dVar75 + dVar20 + dVar19;
  local_228[7] = (((((dVar27 + local_228[7] + dVar46) - dVar57) - dVar75) - dVar43) - dVar20) -
                 dVar19;
  if (iVar31 == 0) {
    local_118[0] = 2.8916149455543745;
    local_118[1] = 3.3887808219431252;
    local_118[2] = 4.665255136408125;
    local_118[3] = 1.5;
    local_118[4] = 1.506900950283125;
    local_118[5] = 2.9628176357525002;
    local_118[6] = 5.2821630604062495;
    local_118[7] = 7.4795990834;
    local_118[8] = 3.1861205355625004;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar13 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_118[0] = 3.8916149455543745;
    local_118[1] = 4.388780821943126;
    local_118[2] = 5.665255136408124;
    local_118[3] = 2.5;
    local_118[4] = 2.506900950283125;
    local_118[5] = 3.9628176357525002;
    local_118[6] = 6.28216306040625;
    local_118[7] = 8.4795990834;
    local_118[8] = 4.1861205355625;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar13 = &local_548;
  }
  dVar49 = 0.0;
  dVar42 = 0.0;
  dVar43 = 0.0;
  lVar12 = 0;
  dVar16 = 0.0;
  do {
    dVar59 = *(double *)((long)adStack_5f0 + lVar12 + 8);
    dVar16 = dVar16 + *(double *)((long)local_118 + lVar12) * dVar59;
    dVar50 = *(double *)((long)pdVar13 + lVar12);
    dVar49 = dVar49 + dVar59 * *(double *)((long)local_c8 + lVar12);
    dVar42 = dVar42 + *(double *)(local_598 + lVar12) * dVar50;
    dVar43 = dVar43 + (*(double *)((long)local_118 + lVar12) - dVar50) * 0.0006666666666666666 *
                      *(double *)(local_598 + lVar12) +
                      dVar50 * *(double *)((long)local_228 + lVar12);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x48);
  dVar42 = dVar42 * (1.0 / dVar16);
  dVar59 = (1.0 / dVar16) * 1500.0;
  dVar16 = dVar42 * dVar59;
  lVar12 = 0;
  do {
    dVar50 = 0.0;
    lVar15 = 0;
    do {
      dVar50 = dVar50 + pdVar13[lVar15] * pdVar14[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 9);
    adStack_4b0[lVar12 * 10] = local_118[lVar12] * dVar16 + dVar50 * -dVar59;
    lVar12 = lVar12 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar12 != 9);
  pdVar14 = &local_4f8;
  local_1e0 = (dVar16 * dVar49 - dVar42) - dVar59 * dVar43;
  lVar12 = 0;
  iVar31 = 0;
  do {
    iVar40 = 0;
    lVar15 = 0;
    do {
      iVar31 = iVar31 + (uint)(pdVar14[lVar15] != 0.0);
      iVar40 = iVar40 + (uint)((pdVar14 + lVar15)[1] != 0.0);
      lVar15 = lVar15 + 2;
    } while (lVar15 != 10);
    iVar31 = iVar40 + iVar31;
    lVar12 = lVar12 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar12 != 10);
  *nJdata = iVar31 * NCELLS;
  return;
}

Assistant:

void
SPARSITY_INFO(int* nJdata, const int* consP, int NCELLS)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  int nJdata_tmp = 0;
  for (int k = 0; k < 10; k++) {
    for (int l = 0; l < 10; l++) {
      if (Jac[10 * k + l] != 0.0) {
        nJdata_tmp = nJdata_tmp + 1;
      }
    }
  }

  *nJdata = NCELLS * nJdata_tmp;
}